

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_d.cpp
# Opt level: O0

double dnrm2(int n,double *x,int incx)

{
  double dVar1;
  double local_48;
  double ssq;
  double scale;
  double norm;
  int ix;
  int i;
  double absxi;
  int incx_local;
  double *x_local;
  int n_local;
  
  if ((n < 1) || (incx < 1)) {
    scale = 0.0;
  }
  else if (n == 1) {
    scale = ABS(*x);
  }
  else {
    ssq = 0.0;
    local_48 = 1.0;
    norm._0_4_ = 0;
    for (norm._4_4_ = 0; norm._4_4_ < n; norm._4_4_ = norm._4_4_ + 1) {
      if ((x[norm._0_4_] != 0.0) || (NAN(x[norm._0_4_]))) {
        dVar1 = ABS(x[norm._0_4_]);
        if (dVar1 <= ssq) {
          local_48 = (dVar1 / ssq) * (dVar1 / ssq) + local_48;
        }
        else {
          local_48 = local_48 * (ssq / dVar1) * (ssq / dVar1) + 1.0;
          ssq = dVar1;
        }
      }
      norm._0_4_ = norm._0_4_ + incx;
    }
    dVar1 = sqrt(local_48);
    scale = ssq * dVar1;
  }
  return scale;
}

Assistant:

double dnrm2 ( int n, double x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    DNRM2 returns the euclidean norm of a vector.
//
//  Discussion:
//
//     DNRM2 ( X ) = sqrt ( X' * X )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 May 2005
//
//  Author:
//
//    Original FORTRAN77 version by Charles Lawson, Richard Hanson, 
//    David Kincaid, Fred Krogh.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, double X[*], the vector whose norm is to be computed.
//
//    Input, int INCX, the increment between successive entries of X.
//
//    Output, double DNRM2, the Euclidean norm of X.
//
{
  double absxi;
  int i;
  int ix;
  double norm;
  double scale;
  double ssq;

  if ( n < 1 || incx < 1 )
  {
    norm = 0.0;
  }
  else if ( n == 1 )
  {
    norm = fabs ( x[0] );
  }
  else
  {
    scale = 0.0;
    ssq = 1.0;
    ix = 0;

    for ( i = 0; i < n; i++ )
    {
      if ( x[ix] != 0.0 )
      {
        absxi = fabs ( x[ix] );
        if ( scale < absxi )
        {
          ssq = 1.0 + ssq * ( scale / absxi ) * ( scale / absxi );
          scale = absxi;
        }
        else
        {
          ssq = ssq + ( absxi / scale ) * ( absxi / scale );
        }
      }
      ix = ix + incx;
    }

    norm  = scale * sqrt ( ssq );
  }

  return norm;
}